

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O1

Poly * __thiscall MT32Emu::PartialManager::assignPolyToPart(PartialManager *this,Part *part)

{
  uint uVar1;
  Bit32u BVar2;
  Poly *this_00;
  
  uVar1 = this->firstFreePolyIndex;
  BVar2 = Synth::getPartialCount(this->synth);
  if (uVar1 < BVar2) {
    uVar1 = this->firstFreePolyIndex;
    this_00 = this->freePolys[uVar1];
    this->freePolys[uVar1] = (Poly *)0x0;
    this->firstFreePolyIndex = uVar1 + 1;
    Poly::setPart(this_00,part);
  }
  else {
    this_00 = (Poly *)0x0;
  }
  return this_00;
}

Assistant:

Poly *PartialManager::assignPolyToPart(Part *part) {
	if (firstFreePolyIndex < synth->getPartialCount()) {
		Poly *poly = freePolys[firstFreePolyIndex];
		freePolys[firstFreePolyIndex] = NULL;
		firstFreePolyIndex++;
		poly->setPart(part);
		return poly;
	}
	return NULL;
}